

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O2

void __thiscall boost::certify::store_ctx::set_server_hostname(store_ctx *this,string_view hostname)

{
  error_code ec_00;
  X509_VERIFY_PARAM *this_00;
  error_code *in_R8;
  string_view hostname_00;
  error_code ec;
  undefined4 local_68;
  uint uStack_64;
  error_category *local_60;
  system_error local_58;
  
  hostname_00.ptr_ = (char *)hostname.len_;
  this_00 = X509_STORE_CTX_get0_param
                      ((X509_STORE_CTX *)
                       (this->handle_)._M_t.
                       super___uniq_ptr_impl<x509_store_ctx_st,_boost::certify::store_ctx::free>.
                       _M_t.
                       super__Tuple_impl<0UL,_x509_store_ctx_st_*,_boost::certify::store_ctx::free>.
                       super__Head_base<0UL,_x509_store_ctx_st_*,_false>._M_head_impl);
  local_68 = 0;
  uStack_64 = uStack_64 & 0xffffff00;
  local_60 = &system::detail::cat_holder<void>::system_category_instance.super_error_category;
  hostname_00.len_ = (size_t)&local_68;
  detail::set_server_hostname
            ((detail *)this_00,(X509_VERIFY_PARAM *)hostname.ptr_,hostname_00,in_R8);
  if ((char)uStack_64 != '\x01') {
    return;
  }
  ec_00._4_4_ = uStack_64;
  ec_00.val_ = local_68;
  ec_00.cat_ = local_60;
  system::system_error::system_error(&local_58,ec_00);
  throw_exception<boost::system::system_error>(&local_58);
}

Assistant:

void set_server_hostname(string_view hostname)
    {
        auto* param = ::X509_STORE_CTX_get0_param(handle_.get());
        system::error_code ec;
        detail::set_server_hostname(param, hostname, ec);
        if (ec)
            boost::throw_exception(system::system_error{ec});
    }